

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Stop_Freeze_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Stop_Freeze_PDU *this)

{
  ostream *poVar1;
  ostream *poVar2;
  KINT32 Value;
  KINT32 Value_00;
  char cVar3;
  ulong uVar4;
  KString local_3e0;
  KString local_3c0;
  string local_3a0 [32];
  KString local_380;
  KString local_360;
  undefined1 local_340 [392];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&local_360,(Header7 *)this);
  poVar1 = std::operator<<(local_1a8,(string *)&local_360);
  poVar1 = std::operator<<(poVar1,"-Stop/Freeze PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_380,&this->super_Simulation_Management_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_380);
  poVar2 = std::operator<<(poVar1,"Real World Time:\n");
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(&local_3e0,&this->m_RealWorldTime);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar1 = (ostream *)(local_340 + 0x10);
  std::operator<<(poVar1,'\t');
  uVar4 = 0;
  while( true ) {
    uVar4 = uVar4 & 0xffff;
    if (local_3e0._M_string_length <= uVar4) break;
    cVar3 = local_3e0._M_dataplus._M_p[uVar4];
    if (local_3e0._M_string_length - 1 != uVar4 && cVar3 == '\n') {
      cVar3 = '\t';
      std::operator<<(poVar1,'\n');
    }
    std::operator<<(poVar1,cVar3);
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  poVar1 = std::operator<<(poVar2,local_3a0);
  poVar1 = std::operator<<(poVar1,"\tReason:           ");
  DATA_TYPE::ENUMS::GetEnumAsStringStopFreezeReason_abi_cxx11_
            ((KString *)local_340,(ENUMS *)(ulong)this->m_ui8Reason,Value);
  poVar1 = std::operator<<(poVar1,(string *)local_340);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Behavior:  ");
  DATA_TYPE::ENUMS::GetEnumAsStringFrozenBehavior_abi_cxx11_
            (&local_3c0,(ENUMS *)(ulong)this->m_ui8FrozenBehaviour,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_3c0);
  poVar1 = std::operator<<(poVar1,"\n\tRequest ID:       ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Stop_Freeze_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Stop/Freeze PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Real World Time:\n"
       << IndentString( m_RealWorldTime.GetAsString(), 1 )
       << "\tReason:           "   << GetEnumAsStringStopFreezeReason( m_ui8Reason )
       << "\n\tFrozen Behavior:  " << GetEnumAsStringFrozenBehavior( m_ui8FrozenBehaviour )
       << "\n\tRequest ID:       " << m_ui32RequestID
       << "\n";

    return ss.str();
}